

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  int *piVar1;
  undefined8 uVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  uint uVar6;
  uint *puVar7;
  void *pvVar8;
  int *__ptr;
  uchar *puVar9;
  unsigned_short *puVar10;
  size_t sVar11;
  uchar uVar12;
  byte bVar13;
  uint i;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint result;
  uint reverse2;
  uint uVar20;
  undefined1 auVar21 [16];
  size_t sVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  
  uVar23 = tree->numcodes;
  uVar19 = (ulong)uVar23;
  puVar7 = (uint *)malloc(uVar19 * 4);
  tree->codes = puVar7;
  uVar20 = tree->maxbitlen;
  uVar6 = uVar20 + 1;
  sVar22 = (ulong)uVar6 * 4;
  pvVar8 = malloc(sVar22);
  __ptr = (int *)malloc(sVar22);
  if (((puVar7 == (uint *)0x0) || (pvVar8 == (void *)0x0)) || (__ptr == (int *)0x0)) {
    free(pvVar8);
    free(__ptr);
    return 0x53;
  }
  if (uVar6 != 0) {
    memset(__ptr,0,sVar22);
    memset(pvVar8,0,sVar22);
  }
  if (uVar19 != 0) {
    puVar5 = tree->lengths;
    uVar15 = 0;
    do {
      piVar1 = (int *)((long)pvVar8 + (ulong)puVar5[uVar15] * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar19 != uVar15);
  }
  if (uVar20 != 0) {
    uVar15 = 2;
    if (2 < uVar6) {
      uVar15 = (ulong)uVar6;
    }
    iVar14 = *__ptr;
    lVar17 = 0;
    do {
      iVar14 = (iVar14 + *(int *)((long)pvVar8 + lVar17 * 4)) * 2;
      __ptr[lVar17 + 1] = iVar14;
      lVar17 = lVar17 + 1;
    } while (uVar15 - 1 != lVar17);
  }
  if (uVar23 != 0) {
    puVar5 = tree->lengths;
    uVar15 = 0;
    do {
      uVar16 = (ulong)puVar5[uVar15];
      if (uVar16 != 0) {
        uVar20 = __ptr[uVar16];
        __ptr[uVar16] = uVar20 + 1;
        puVar7[uVar15] = uVar20;
        puVar7[uVar15] = ~(-1 << ((byte)puVar5[uVar15] & 0x1f)) & uVar20;
      }
      uVar15 = uVar15 + 1;
    } while (uVar19 != uVar15);
  }
  free(pvVar8);
  free(__ptr);
  pvVar8 = calloc(1,0x800);
  if (pvVar8 != (void *)0x0) {
    if (uVar23 != 0) {
      puVar5 = tree->lengths;
      uVar15 = 0;
      do {
        uVar23 = puVar5[uVar15];
        if (9 < uVar23) {
          uVar16 = 0;
          uVar20 = 8;
          iVar14 = 0;
          do {
            uVar16 = (ulong)((uint)uVar16 |
                            (uint)(((puVar7[uVar15] >> ((char)uVar23 - 9U & 0x1f)) >>
                                    (uVar20 & 0x1f) & 1) != 0) << ((byte)iVar14 & 0x1f));
            iVar14 = iVar14 + 1;
            uVar20 = uVar20 - 1;
          } while (iVar14 != 9);
          uVar20 = *(uint *)((long)pvVar8 + uVar16 * 4);
          if (uVar23 < uVar20) {
            uVar23 = uVar20;
          }
          *(uint *)((long)pvVar8 + uVar16 * 4) = uVar23;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar19);
    }
    auVar21 = ZEXT416(0x200);
    lVar17 = 0;
    do {
      uVar2 = *(undefined8 *)((long)pvVar8 + lVar17 * 4);
      uVar23 = (uint)uVar2;
      uVar20 = (uint)((ulong)uVar2 >> 0x20);
      auVar24._0_8_ =
           CONCAT44(-(uint)(-0x7ffffff7 < (int)(uVar23 ^ 0x80000000)),
                    -(uint)(-0x7ffffff7 < (int)(uVar23 ^ 0x80000000)));
      auVar24._8_4_ = -(uint)(-0x7ffffff7 < (int)(uVar20 ^ 0x80000000));
      auVar24._12_4_ = -(uint)(-0x7ffffff7 < (int)(uVar20 ^ 0x80000000));
      lVar18 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + (1L << (ulong)(uVar23 - 9) & auVar24._0_8_);
      auVar21._8_8_ = lVar18 + (auVar24._8_8_ & 1);
      lVar17 = lVar17 + 2;
    } while (lVar17 != 0x200);
    sVar22 = auVar21._8_8_ + auVar21._0_8_;
    puVar9 = (uchar *)malloc(sVar22);
    tree->table_len = puVar9;
    puVar10 = (unsigned_short *)malloc(sVar22 * 2);
    tree->table_value = puVar10;
    if (puVar10 == (unsigned_short *)0x0 || puVar9 == (uchar *)0x0) {
      free(pvVar8);
      return 0x53;
    }
    if (sVar22 != 0) {
      sVar11 = 0;
      do {
        tree->table_len[sVar11] = '\x10';
        sVar11 = sVar11 + 1;
      } while (sVar22 != sVar11);
    }
    lVar17 = 0x200;
    lVar18 = 0;
    do {
      uVar23 = *(uint *)((long)pvVar8 + lVar18 * 4);
      if (9 < uVar23) {
        uVar12 = (uchar)uVar23;
        tree->table_len[lVar18] = uVar12;
        tree->table_value[lVar18] = (unsigned_short)lVar17;
        lVar17 = lVar17 + (1L << (uVar12 - 9 & 0x3f));
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x200);
    free(pvVar8);
    if (tree->numcodes != 0) {
      uVar19 = 0;
      uVar15 = 0;
      do {
        uVar23 = tree->lengths[uVar19];
        if (uVar23 != 0) {
          uVar6 = 0;
          bVar13 = 0;
          uVar20 = uVar23;
          do {
            uVar20 = uVar20 - 1;
            uVar6 = uVar6 | (uint)((tree->codes[uVar19] >> (uVar20 & 0x1f) & 1) != 0) <<
                            (bVar13 & 0x1f);
            bVar13 = bVar13 + 1;
          } while (uVar20 != 0);
          uVar15 = uVar15 + 1;
          bVar13 = (byte)uVar23;
          if (uVar23 < 10) {
            uVar23 = 1;
            do {
              uVar20 = uVar23 - 1 << (bVar13 & 0x1f) | uVar6;
              if (tree->table_len[uVar20] != '\x10') {
                return 0x37;
              }
              tree->table_len[uVar20] = bVar13;
              tree->table_value[uVar20] = (unsigned_short)uVar19;
              uVar20 = uVar23 >> (9 - bVar13 & 0x1f);
              uVar23 = uVar23 + 1;
            } while (uVar20 == 0);
          }
          else {
            bVar3 = tree->table_len[uVar6 & 0x1ff];
            if (bVar3 < uVar23) {
              return 0x37;
            }
            uVar4 = tree->table_value[uVar6 & 0x1ff];
            uVar23 = 1;
            do {
              uVar20 = (uVar23 - 1 << (bVar13 - 9 & 0x1f) | uVar6 >> 9) + (uint)uVar4;
              tree->table_len[uVar20] = bVar13;
              tree->table_value[uVar20] = (unsigned_short)uVar19;
              uVar20 = uVar23 >> (bVar3 - bVar13 & 0x1f);
              uVar23 = uVar23 + 1;
            } while (uVar20 == 0);
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < tree->numcodes);
      if (1 < uVar15) {
        if (sVar22 == 0) {
          return 0;
        }
        sVar11 = 0;
        do {
          if (tree->table_len[sVar11] == '\x10') {
            return 0x37;
          }
          sVar11 = sVar11 + 1;
        } while (sVar22 != sVar11);
        return 0;
      }
    }
    if (sVar22 != 0) {
      uVar19 = 0;
      do {
        if (tree->table_len[uVar19] == '\x10') {
          tree->table_len[uVar19] = (0x1ff < uVar19) * '\t' + '\x01';
          tree->table_value[uVar19] = 0xffff;
        }
        uVar19 = uVar19 + 1;
      } while (sVar22 != uVar19);
    }
    return 0;
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}